

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dws.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string *str,string *delim)

{
  size_t sVar1;
  string *psVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  value_type local_58;
  ulong local_38;
  size_t end;
  size_t start;
  string *local_20;
  string *delim_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parts;
  
  start._7_1_ = 0;
  local_20 = delim;
  delim_local = str;
  str_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  local_38 = 0;
  while (uVar4 = local_38, uVar3 = std::__cxx11::string::size(), uVar4 < uVar3) {
    end = local_38;
    while( true ) {
      sVar1 = end;
      uVar4 = std::__cxx11::string::size();
      psVar2 = local_20;
      bVar7 = false;
      if (sVar1 < uVar4) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)delim_local);
        lVar6 = std::__cxx11::string::find((char)psVar2,(ulong)(uint)(int)*pcVar5);
        bVar7 = lVar6 != -1;
      }
      if (!bVar7) break;
      end = end + 1;
    }
    local_38 = end;
    while( true ) {
      uVar4 = local_38;
      uVar3 = std::__cxx11::string::size();
      psVar2 = local_20;
      bVar7 = false;
      if (uVar4 < uVar3) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)delim_local);
        lVar6 = std::__cxx11::string::find((char)psVar2,(ulong)(uint)(int)*pcVar5);
        bVar7 = lVar6 == -1;
      }
      if (!bVar7) break;
      local_38 = local_38 + 1;
    }
    if (local_38 != end) {
      std::__cxx11::string::string((string *)&local_58,(string *)delim_local,end,local_38 - end);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> split(const string& str, const string& delim)
{
	vector<string> parts;
	size_t start;
	size_t end = 0;
	while (end < str.size())
	{
		start = end;
		while (start < str.size() && (delim.find(str[start]) != string::npos))
			start++; // skip initial whitespace
		end = start;
		while (end < str.size() && (delim.find(str[end]) == string::npos))
			end++; // skip to end of word
		if (end - start != 0) // just ignore zero-length strings.
			parts.push_back(string(str, start, end - start));
	}
	return parts;
}